

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.cc
# Opt level: O0

void __thiscall rcdiscover::DeviceInfo::set(DeviceInfo *this,uint8_t *raw,size_t len)

{
  ulong in_RDX;
  undefined1 *in_RSI;
  DeviceInfo *in_RDI;
  size_t in_stack_000000a0;
  uint8_t *in_stack_000000a8;
  int i_3;
  int i_2;
  int i_1;
  int i;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  ulong local_18;
  undefined1 *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  clear(in_RDI);
  if (3 < local_18) {
    in_RDI->major = (uint)CONCAT11(*local_10,local_10[1]);
    in_RDI->minor = (uint)CONCAT11(local_10[2],local_10[3]);
  }
  if (0xf < local_18) {
    in_RDI->mac = 0;
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      in_RDI->mac = in_RDI->mac << 8 | (ulong)(byte)local_10[local_1c + 10];
    }
  }
  if (0x27 < local_18) {
    in_RDI->ip = 0;
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      in_RDI->ip = in_RDI->ip << 8 | (uint)(byte)local_10[local_20 + 0x24];
    }
  }
  if (0x37 < local_18) {
    in_RDI->subnet = 0;
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      in_RDI->subnet = in_RDI->subnet << 8 | (uint)(byte)local_10[local_24 + 0x34];
    }
  }
  if (0x47 < local_18) {
    in_RDI->gateway = 0;
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      in_RDI->gateway = in_RDI->gateway << 8 | (uint)(byte)local_10[local_28 + 0x44];
    }
  }
  if (0x67 < local_18) {
    (anonymous_namespace)::extract_abi_cxx11_(in_stack_000000a8,in_stack_000000a0);
    std::__cxx11::string::operator=((string *)&in_RDI->manufacturer_name,local_48);
    std::__cxx11::string::~string(local_48);
  }
  if (0x87 < local_18) {
    (anonymous_namespace)::extract_abi_cxx11_(in_stack_000000a8,in_stack_000000a0);
    std::__cxx11::string::operator=((string *)&in_RDI->model_name,local_68);
    std::__cxx11::string::~string(local_68);
  }
  if (0xa7 < local_18) {
    (anonymous_namespace)::extract_abi_cxx11_(in_stack_000000a8,in_stack_000000a0);
    std::__cxx11::string::operator=((string *)&in_RDI->device_version,local_88);
    std::__cxx11::string::~string(local_88);
  }
  if (0xd7 < local_18) {
    (anonymous_namespace)::extract_abi_cxx11_(in_stack_000000a8,in_stack_000000a0);
    std::__cxx11::string::operator=((string *)&in_RDI->manufacturer_info,local_a8);
    std::__cxx11::string::~string(local_a8);
  }
  if (0xe7 < local_18) {
    (anonymous_namespace)::extract_abi_cxx11_(in_stack_000000a8,in_stack_000000a0);
    std::__cxx11::string::operator=((string *)&in_RDI->serial_number,local_c8);
    std::__cxx11::string::~string(local_c8);
  }
  if (0xf7 < local_18) {
    (anonymous_namespace)::extract_abi_cxx11_(in_stack_000000a8,in_stack_000000a0);
    std::__cxx11::string::operator=((string *)&in_RDI->user_name,local_e8);
    std::__cxx11::string::~string(local_e8);
  }
  return;
}

Assistant:

void DeviceInfo::set(const uint8_t *raw, size_t len)
{
  // clear stored information

  clear();

  // extract information

  if (len >= 4)
  {
    major=(static_cast<int>(raw[0])<<8)|raw[1];
    minor=(static_cast<int>(raw[2])<<8)|raw[3];
  }

  if (len >= 16)
  {
    mac=0;
    for (int i=0; i<6; i++) mac=(mac<<8)|raw[10+i];
  }

  if (len >= 40)
  {
    ip=0;
    for (int i=0; i<4; i++) ip=(ip<<8)|raw[36+i];
  }

  if (len >= 56)
  {
    subnet=0;
    for (int i=0; i<4; i++) subnet=(subnet<<8)|raw[52+i];
  }

  if (len >= 72)
  {
    gateway=0;
    for (int i=0; i<4; i++) gateway=(gateway<<8)|raw[68+i];
  }

  if (len >= 104) manufacturer_name=extract(raw+72, 32);
  if (len >= 136) model_name=extract(raw+104, 32);
  if (len >= 168) device_version=extract(raw+136, 32);
  if (len >= 216) manufacturer_info=extract(raw+168, 48);
  if (len >= 232) serial_number=extract(raw+216, 16);
  if (len >= 248) user_name=extract(raw+232, 16);
}